

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9AbsRefine(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_3c;
  uint local_38;
  int fVerbose;
  int fSensePath;
  int fTryFour;
  int nFfToAddMax;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fSensePath = 0;
  fVerbose = 1;
  local_38 = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Mtsvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9AbsRefine(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9AbsRefine(): There is no counter-example.\n");
        return 1;
      }
      iVar1 = Gia_ManCexAbstractionRefine
                        (pAbc->pGia,pAbc->pCex,fSensePath,fVerbose,local_38,local_3c);
      pAbc->Status = iVar1;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    switch(iVar1) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_002798ba;
      }
      fSensePath = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fSensePath < 0) {
LAB_002798ba:
        Abc_Print(-2,"usage: &abs_refine [-M <num>] [-tsvh]\n");
        Abc_Print(-2,"\t         refines the pre-computed flop map using the counter-example\n");
        Abc_Print(-2,"\t-M num : the max number of flops to add (0 = not used) [default = %d]\n",
                  (ulong)(uint)fSensePath);
        pcVar2 = "no";
        if (fVerbose != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-t     : toggle trying four abstractions instead of one [default = %s]\n",
                  pcVar2);
        pcVar2 = "no";
        if (local_38 != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle using the path sensitization algorithm [default = %s]\n",
                  pcVar2);
        pcVar2 = "no";
        if (local_3c != 0) {
          pcVar2 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002798ba;
    case 0x68:
      goto LAB_002798ba;
    case 0x73:
      local_38 = local_38 ^ 1;
      break;
    case 0x74:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x76:
      local_3c = local_3c ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9AbsRefine( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Gia_Man_t * pTemp = NULL;
    int c;
    int nFfToAddMax = 0;
    int fTryFour    = 1;
    int fSensePath  = 0;
    int fVerbose    = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mtsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nFfToAddMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFfToAddMax < 0 )
                goto usage;
            break;
        case 't':
            fTryFour ^= 1;
            break;
        case 's':
            fSensePath ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsRefine(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsRefine(): There is no counter-example.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManCexAbstractionRefine( pAbc->pGia, pAbc->pCex, nFfToAddMax, fTryFour, fSensePath, fVerbose );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &abs_refine [-M <num>] [-tsvh]\n" );
    Abc_Print( -2, "\t         refines the pre-computed flop map using the counter-example\n" );
    Abc_Print( -2, "\t-M num : the max number of flops to add (0 = not used) [default = %d]\n", nFfToAddMax );
    Abc_Print( -2, "\t-t     : toggle trying four abstractions instead of one [default = %s]\n", fTryFour? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using the path sensitization algorithm [default = %s]\n", fSensePath? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}